

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O0

bool pbrt::ParseArg<pstd::span<float>>
               (char ***argv,string *name,span<float> out,
               function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *onError)

{
  span<float> out_00;
  span<float> out_01;
  span<float> ptr;
  byte bVar1;
  byte bVar2;
  undefined1 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  size_t in_RCX;
  float *in_RDX;
  long *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string value;
  string arg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc4;
  undefined1 in_stack_fffffffffffffdc5;
  undefined1 in_stack_fffffffffffffdc6;
  char in_stack_fffffffffffffdc7;
  char *fmt;
  allocator<char> *__a;
  string *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  allocator<char> local_1f9;
  string local_1f8 [32];
  string local_1d8 [16];
  string *in_stack_fffffffffffffe38;
  float *in_stack_fffffffffffffe40;
  size_t in_stack_fffffffffffffe48;
  string local_1a0 [32];
  string local_180 [36];
  undefined4 local_15c;
  string local_158 [32];
  float *local_138;
  size_t sStack_130;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [55];
  allocator<char> local_51;
  string local_50 [48];
  long *local_20;
  float *local_18;
  size_t sStack_10;
  byte local_1;
  
  fmt = *(char **)*in_RDI;
  __a = &local_51;
  local_20 = in_RDI;
  local_18 = in_RDX;
  sStack_10 = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8,__a);
  std::allocator<char>::~allocator(&local_51);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::__cxx11::string::operator[]((ulong)local_50);
  if (__lhs->_M_dataplus == (_Alloc_hider)0x2d) {
    std::__cxx11::string::substr((ulong)local_88,(ulong)local_50);
    std::__cxx11::string::operator=(local_50,local_88);
    std::__cxx11::string::~string(local_88);
  }
  else {
    std::__cxx11::string::substr((ulong)local_a8,(ulong)local_50);
    std::__cxx11::string::operator=(local_50,local_a8);
    std::__cxx11::string::~string(local_a8);
  }
  anon_unknown_4::normalizeArg(in_stack_fffffffffffffde8);
  std::operator+(__lhs,in_stack_fffffffffffffdc7);
  anon_unknown_4::normalizeArg(in_stack_fffffffffffffde8);
  bVar1 = anon_unknown_4::matchPrefix
                    (__lhs,(string *)
                           CONCAT17(in_stack_fffffffffffffdc7,
                                    CONCAT16(in_stack_fffffffffffffdc6,
                                             CONCAT15(in_stack_fffffffffffffdc5,
                                                      CONCAT14(in_stack_fffffffffffffdc4,
                                                               in_stack_fffffffffffffdc0)))));
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_c8);
  if ((bVar1 & 1) == 0) {
    anon_unknown_4::normalizeArg(in_stack_fffffffffffffde8);
    anon_unknown_4::normalizeArg(in_stack_fffffffffffffde8);
    bVar2 = std::operator==(in_R8,__lhs);
    std::__cxx11::string::~string(local_1a0);
    std::__cxx11::string::~string(local_180);
    if ((bVar2 & 1) == 0) {
      local_1 = 0;
      local_15c = 1;
    }
    else {
      *local_20 = *local_20 + 8;
      ptr.n = sStack_10;
      ptr.ptr = local_18;
      uVar3 = (anonymous_namespace)::enable<pstd::span<float>>(ptr);
      if ((bool)uVar3) {
        local_1 = 1;
        local_15c = 1;
      }
      else if (*(long *)*local_20 == 0) {
        StringPrintf<std::__cxx11::string&>(fmt,in_R8);
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::operator()((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                      *)CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffdc6,
                                                CONCAT15(bVar2,CONCAT14(uVar3,
                                                  in_stack_fffffffffffffdc0)))),
                     in_stack_fffffffffffffdb8);
        std::__cxx11::string::~string(local_1d8);
        local_1 = 0;
        local_15c = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8,__a);
        out_01.n = (size_t)local_18;
        out_01.ptr = in_stack_fffffffffffffe40;
        anon_unknown_4::initArg(in_stack_fffffffffffffe38,out_01);
        std::__cxx11::string::~string(local_1f8);
        std::allocator<char>::~allocator(&local_1f9);
        *local_20 = *local_20 + 8;
        local_1 = 1;
        local_15c = 1;
      }
    }
  }
  else {
    *local_20 = *local_20 + 8;
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_128,(ulong)local_50);
    local_138 = local_18;
    sStack_130 = sStack_10;
    out_00.n = in_stack_fffffffffffffe48;
    out_00.ptr = in_stack_fffffffffffffe40;
    local_1 = anon_unknown_4::initArg(in_stack_fffffffffffffe38,out_00);
    if (!(bool)local_1) {
      uVar3 = local_1;
      StringPrintf<std::__cxx11::string&,std::__cxx11::string_const&>(fmt,in_R8,__lhs);
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::operator()((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                    *)CONCAT17(bVar1,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffffdc5,
                                                             CONCAT14(in_stack_fffffffffffffdc4,
                                                                      in_stack_fffffffffffffdc0)))),
                   in_stack_fffffffffffffdb8);
      std::__cxx11::string::~string(local_158);
    }
    local_15c = 1;
    std::__cxx11::string::~string(local_128);
  }
  std::__cxx11::string::~string(local_50);
  return (bool)(local_1 & 1);
}

Assistant:

bool ParseArg(char ***argv, const std::string &name, T out,
              std::function<void(std::string)> onError) {
    std::string arg = **argv;

    // Strip either one or two leading dashes.
    if (arg[1] == '-')
        arg = arg.substr(2);
    else
        arg = arg.substr(1);

    if (matchPrefix(normalizeArg(arg), normalizeArg(name + '='))) {
        // --arg=value
        *argv += 1;
        std::string value = arg.substr(name.size() + 1);
        if (!initArg(value, out)) {
            onError(StringPrintf("invalid value \"%s\" for %s argument", value, name));
            return false;
        }
        return true;
    } else if (normalizeArg(arg) == normalizeArg(name)) {
        // --arg <value>, except for bool arguments, which are set to true
        // without expecting another argument.
        *argv += 1;
        if (enable(out))
            return true;

        if (**argv == nullptr) {
            onError(StringPrintf("missing value after %s argument", arg));
            return false;
        }
        initArg(**argv, out);
        *argv += 1;
        return true;
    } else
        return false;
}